

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O0

void __thiscall QTipLabel::timerEvent(QTipLabel *this,QTimerEvent *e)

{
  int iVar1;
  int iVar2;
  QTipLabel *in_RDI;
  
  iVar1 = QTimerEvent::timerId((QTimerEvent *)0x4c0be6);
  iVar2 = QBasicTimer::timerId((QBasicTimer *)0x4c0bf8);
  if (iVar1 != iVar2) {
    iVar1 = QTimerEvent::timerId((QTimerEvent *)0x4c0c0c);
    iVar2 = QBasicTimer::timerId((QBasicTimer *)0x4c0c1e);
    if (iVar1 != iVar2) {
      return;
    }
  }
  QBasicTimer::stop();
  QBasicTimer::stop();
  hideTipImmediately(in_RDI);
  return;
}

Assistant:

void QTipLabel::timerEvent(QTimerEvent *e)
{
    if (e->timerId() == hideTimer.timerId()
        || e->timerId() == expireTimer.timerId()){
        hideTimer.stop();
        expireTimer.stop();
        hideTipImmediately();
    }
}